

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 graph_size)

{
  ImVec4 *pIVar1;
  int iVar2;
  ImU32 IVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ImGuiContext *pIVar10;
  ImGuiPlotType IVar11;
  _func_float_void_ptr_int *p_Var12;
  void *pvVar13;
  bool bVar14;
  ImU32 IVar15;
  ImU32 IVar16;
  uint uVar17;
  ulong uVar18;
  undefined4 in_register_0000008c;
  int iVar19;
  float fVar20;
  float fVar21;
  uint in_XMM0_Db;
  ImVec2 IVar22;
  float fVar23;
  ImVec2 pos;
  uint in_XMM0_Dc;
  undefined4 uVar24;
  uint in_XMM0_Dd;
  undefined4 uVar25;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar26;
  ImVec2 pos1;
  ImRect frame_bb;
  ImVec2 pos0;
  ImRect inner_bb;
  ImRect total_bb;
  ImVec2 local_160;
  undefined1 local_158 [8];
  undefined4 uStack_150;
  undefined4 uStack_14c;
  ulong local_148;
  ImGuiPlotType local_13c;
  ImRect local_138;
  ImVec2 local_128;
  undefined8 uStack_120;
  _func_float_void_ptr_int *local_110;
  ImVec4 local_108;
  ImRect local_f8;
  float local_e8;
  float local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  void *local_c8;
  ImGuiWindow *local_c0;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  ulong local_a8;
  undefined8 uStack_a0;
  ImGuiContext *local_90;
  char *local_88;
  ulong local_80;
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  undefined1 local_58 [24];
  ImRect local_40;
  
  pIVar10 = GImGui;
  local_148 = CONCAT44(in_register_0000008c,values_offset);
  local_c0 = GImGui->CurrentWindow;
  local_c0->WriteAccessed = true;
  if (local_c0->SkipItems == false) {
    uStack_150 = in_XMM2_Dc;
    local_158 = (undefined1  [8])graph_size;
    uStack_14c = in_XMM2_Dd;
    local_110 = values_getter;
    local_e8 = scale_max;
    local_d8 = scale_min;
    uStack_d4 = in_XMM0_Db;
    uStack_d0 = in_XMM0_Dc;
    uStack_cc = in_XMM0_Dd;
    local_88 = label;
    IVar22 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_68 = IVar22.x;
    fStack_64 = IVar22.y;
    fVar20 = (float)local_158._0_4_;
    if (((float)local_158._0_4_ == 0.0) && (!NAN((float)local_158._0_4_))) {
      fVar20 = CalcItemWidth();
      IVar22.y = fStack_64;
      IVar22.x = local_68;
    }
    if (((float)local_158._4_4_ == 0.0) && (!NAN((float)local_158._4_4_))) {
      fVar26 = (pIVar10->Style).FramePadding.y;
      local_158._4_4_ = fVar26 + fVar26 + IVar22.y;
    }
    local_158._0_4_ = fVar20;
    local_138.Max.x = (local_c0->DC).CursorPos.x + fVar20;
    fVar20 = (float)local_158._4_4_ + (local_c0->DC).CursorPos.y;
    local_138.Max.y = fVar20;
    local_138.Min = (local_c0->DC).CursorPos;
    local_f8.Max.x = (pIVar10->Style).FramePadding.x;
    local_f8.Max.y = (pIVar10->Style).FramePadding.y;
    local_f8.Min.x = local_138.Min.x + local_f8.Max.x;
    local_f8.Min.y = local_138.Min.y + local_f8.Max.y;
    local_f8.Max.x = local_138.Max.x - local_f8.Max.x;
    local_f8.Max.y = fVar20 - local_f8.Max.y;
    fVar26 = 0.0;
    if (0.0 < IVar22.x) {
      fVar26 = (pIVar10->Style).ItemInnerSpacing.x + local_68;
    }
    local_40.Max.x = local_138.Max.x + fVar26;
    local_40.Max.y = fVar20 + 0.0;
    local_108.x = local_40.Max.x - local_138.Min.x;
    local_108.y = (fVar20 + 0.0) - local_138.Min.y;
    local_40.Min = local_138.Min;
    ItemSize((ImVec2 *)&local_108,(pIVar10->Style).FramePadding.y);
    bVar14 = ItemAdd(&local_40,0,&local_138);
    if (bVar14) {
      bVar14 = ItemHoverable(&local_f8,0);
      p_Var12 = local_110;
      local_a8 = CONCAT71(local_a8._1_7_,bVar14);
      local_c8 = data;
      if (((local_d8 == 3.4028235e+38) && (!NAN(local_d8))) ||
         ((local_e8 == 3.4028235e+38 && (!NAN(local_e8))))) {
        if (values_count < 1) {
          fVar20 = -3.4028235e+38;
          local_128.x = 3.4028235e+38;
          local_128.y = 0.0;
          uStack_120._0_4_ = 0;
          uStack_120._4_4_ = 0;
        }
        else {
          iVar19 = 0;
          fVar20 = -3.4028235e+38;
          local_128.x = 3.4028235e+38;
          local_128.y = 0.0;
          uStack_120._0_4_ = 0;
          uStack_120._4_4_ = 0;
          do {
            fVar26 = (*p_Var12)(data,iVar19);
            if (fVar26 <= local_128.x) {
              local_128.x = fVar26;
            }
            fVar20 = (float)(-(uint)(fVar26 <= fVar20) & (uint)fVar20 |
                            ~-(uint)(fVar26 <= fVar20) & (uint)fVar26);
            iVar19 = iVar19 + 1;
          } while (values_count != iVar19);
        }
        uStack_d4 = (uint)local_128.y & uStack_d4;
        uStack_d0 = (uint)uStack_120 & uStack_d0;
        uStack_cc = uStack_120._4_4_ & uStack_cc;
        local_d8 = (float)(~-(uint)(local_d8 == 3.4028235e+38) & (uint)local_d8 |
                          (uint)local_128.x & -(uint)(local_d8 == 3.4028235e+38));
        local_e8 = (float)(~-(uint)(local_e8 == 3.4028235e+38) & (uint)local_e8 |
                          (uint)fVar20 & -(uint)(local_e8 == 3.4028235e+38));
      }
      IVar22 = local_138.Max;
      local_128 = local_138.Min;
      uStack_120 = 0;
      local_108.x = (GImGui->Style).Colors[7].x;
      local_108.y = (GImGui->Style).Colors[7].y;
      uVar4 = (GImGui->Style).Colors[7].z;
      uVar5 = (GImGui->Style).Colors[7].w;
      local_108.w = (GImGui->Style).Alpha * (float)uVar5;
      local_108.z = (float)uVar4;
      IVar15 = ColorConvertFloat4ToU32(&local_108);
      local_90 = pIVar10;
      RenderFrame(local_128,IVar22,IVar15,true,(pIVar10->Style).FrameRounding);
      pvVar13 = local_c8;
      p_Var12 = local_110;
      if (0 < values_count) {
        iVar19 = (int)(float)local_158._0_4_;
        if (values_count <= (int)(float)local_158._0_4_) {
          iVar19 = values_count;
        }
        bVar14 = plot_type == ImGuiPlotType_Lines;
        fVar20 = (float)(values_count - (uint)bVar14);
        local_128.x = fVar20;
        uVar18 = 0xffffffff;
        local_13c = plot_type;
        if ((char)local_a8 != '\0') {
          fVar21 = ((local_90->IO).MousePos.x - local_f8.Min.x) / (local_f8.Max.x - local_f8.Min.x);
          fVar26 = 0.9999;
          if (fVar21 <= 0.9999) {
            fVar26 = fVar21;
          }
          uVar17 = (uint)((float)(int)fVar20 * (float)(~-(uint)(fVar21 < 0.0) & (uint)fVar26));
          uVar18 = (ulong)uVar17;
          if ((uint)values_count <= uVar17) {
            __assert_fail("v_idx >= 0 && v_idx < values_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                          ,0x25b9,
                          "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                         );
          }
          iVar2 = (int)local_148;
          fVar20 = (*local_110)(local_c8,(int)(uVar17 + iVar2) % values_count);
          local_158._0_4_ = fVar20;
          (*p_Var12)(pvVar13,(int)(uVar17 + iVar2 + 1) % values_count);
          plot_type = local_13c;
          if (local_13c == ImGuiPlotType_Lines) {
            SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar17,(ulong)(uVar17 + 1));
          }
          else if (local_13c == ImGuiPlotType_Histogram) {
            SetTooltip("%d: %8.4g",(double)(float)local_158._0_4_,(ulong)uVar17);
          }
        }
        iVar19 = iVar19 - (uint)bVar14;
        local_a8 = (ulong)(~-(uint)(local_d8 == local_e8) & (uint)(1.0 / (local_e8 - local_d8)));
        uStack_a0 = 0;
        fVar20 = (*local_110)(local_c8,(int)((long)((ulong)(uint)((int)local_148 >> 0x1f) << 0x20 |
                                                   local_148 & 0xffffffff) % (long)values_count));
        pIVar10 = GImGui;
        local_158._0_4_ = fVar20;
        if (0.0 <= local_e8 * local_d8) {
          uStack_74 = 0;
          local_78 = (float)(~-(uint)(local_d8 < 0.0) & 0x3f800000);
          uStack_70 = 0;
          uStack_6c = 0;
        }
        else {
          uStack_74 = uStack_d4 ^ 0x80000000;
          uStack_70 = uStack_d0 ^ 0x80000000;
          uStack_6c = uStack_cc ^ 0x80000000;
          local_78 = -local_d8 * (float)local_a8;
        }
        pIVar1 = (GImGui->Style).Colors + (ulong)(plot_type != ImGuiPlotType_Lines) * 2 + 0x21;
        local_108.x = pIVar1->x;
        local_108.y = pIVar1->y;
        uVar6 = pIVar1->z;
        uVar7 = pIVar1->w;
        fVar20 = (GImGui->Style).Alpha;
        local_108.w = (float)uVar7 * fVar20;
        local_108.z = (float)uVar6;
        local_80 = uVar18;
        IVar15 = ColorConvertFloat4ToU32(&local_108);
        IVar11 = local_13c;
        pIVar1 = (pIVar10->Style).Colors + (ulong)(plot_type != ImGuiPlotType_Lines) * 2 + 0x22;
        local_108.x = pIVar1->x;
        local_108.y = pIVar1->y;
        uVar8 = pIVar1->z;
        uVar9 = pIVar1->w;
        local_108.w = fVar20 * (float)uVar9;
        local_108.z = (float)uVar8;
        IVar16 = ColorConvertFloat4ToU32(&local_108);
        if (0 < iVar19) {
          fVar26 = (float)local_a8 * ((float)local_158._0_4_ - local_d8);
          fVar20 = 1.0;
          if (fVar26 <= 1.0) {
            fVar20 = fVar26;
          }
          local_e8 = (float)(int)local_128.x;
          local_58._0_16_ = ZEXT416((uint)(1.0 / (float)iVar19));
          local_148 = (ulong)((int)local_148 + 1);
          local_ac = local_f8.Min.x;
          local_b4 = local_f8.Max.x - local_f8.Min.x;
          local_b8 = local_f8.Max.y - local_f8.Min.y;
          local_78 = local_78 * local_b8 + local_f8.Min.y;
          local_b0 = local_f8.Min.y;
          fVar21 = 0.0;
          fVar23 = 0.0;
          uVar24 = 0;
          uVar25 = 0;
          fVar20 = (float)(-(uint)(fVar26 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar26 < 0.0) & (uint)(1.0 - fVar20));
          do {
            uVar17 = (uint)(fVar21 * local_e8 + 0.5);
            if ((uint)values_count <= uVar17) {
              __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                            ,0x25d3,
                            "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                           );
            }
            local_128.y = (float)local_58._4_4_;
            local_128.x = (float)local_58._0_4_ + fVar21;
            uStack_120 = local_58._8_8_;
            local_158._4_4_ = fVar23;
            local_158._0_4_ = fVar21;
            uStack_150 = uVar24;
            uStack_14c = uVar25;
            fVar26 = (*local_110)(local_c8,(int)((int)local_148 + uVar17) % values_count);
            fVar21 = (fVar26 - local_d8) * (float)local_a8;
            fVar26 = 1.0;
            if (fVar21 <= 1.0) {
              fVar26 = fVar21;
            }
            fVar26 = (float)(-(uint)(fVar21 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar21 < 0.0) & (uint)(1.0 - fVar26));
            fVar21 = (float)local_158._0_4_ * local_b4 + local_ac;
            local_108.y = fVar20 * local_b8 + local_b0;
            local_108.x = fVar21;
            fVar20 = local_b4 * local_128.x + local_ac;
            if (IVar11 == ImGuiPlotType_Lines) {
              local_160.y = local_b8 * fVar26 + local_b0;
              local_160.x = fVar20;
              IVar3 = IVar15;
              if ((uint)local_80 == uVar17) {
                IVar3 = IVar16;
              }
              ImDrawList::AddLine(local_c0->DrawList,(ImVec2 *)&local_108,&local_160,IVar3,1.0);
            }
            else {
              local_160.y = local_78;
              local_160.x = fVar20;
              if (IVar11 == ImGuiPlotType_Histogram) {
                if (fVar21 + 2.0 <= fVar20) {
                  local_160.x = fVar20 + -1.0;
                }
                IVar3 = IVar15;
                if ((uint)local_80 == uVar17) {
                  IVar3 = IVar16;
                }
                ImDrawList::AddRectFilled
                          (local_c0->DrawList,(ImVec2 *)&local_108,&local_160,IVar3,0.0,0xf);
              }
            }
            iVar19 = iVar19 + -1;
            fVar21 = local_128.x;
            fVar23 = local_128.y;
            uVar24 = (uint)uStack_120;
            uVar25 = uStack_120._4_4_;
            fVar20 = fVar26;
          } while (iVar19 != 0);
        }
      }
      pIVar10 = local_90;
      if (overlay_text != (char *)0x0) {
        local_108.y = local_138.Min.y + (local_90->Style).FramePadding.y;
        local_108.x = local_138.Min.x;
        local_160.x = 0.5;
        local_160.y = 0.0;
        RenderTextClipped((ImVec2 *)&local_108,&local_138.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0
                          ,&local_160,(ImRect *)0x0);
      }
      if (0.0 < local_68) {
        pos.x = local_138.Max.x + (pIVar10->Style).ItemInnerSpacing.x;
        pos.y = local_f8.Min.y;
        RenderText(pos,local_88,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 graph_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (graph_size.x == 0.0f)
        graph_size.x = CalcItemWidth();
    if (graph_size.y == 0.0f)
        graph_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(graph_size.x, graph_size.y));
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return;
    const bool hovered = ItemHoverable(inner_bb, 0);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    if (values_count > 0)
    {
        int res_w = ImMin((int)graph_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        int v_hovered = -1;
        if (hovered)
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            v_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}